

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChElementBeamANCF_3243.cpp
# Opt level: O3

ChVector<double> * __thiscall
chrono::fea::ChElementBeamANCF_3243::ComputeTangent
          (ChVector<double> *__return_storage_ptr__,ChElementBeamANCF_3243 *this,double xi)

{
  bool bVar1;
  PointerType ptr;
  undefined1 auVar2 [32];
  undefined1 auVar3 [32];
  undefined1 auVar4 [64];
  undefined1 auVar5 [64];
  undefined1 auVar6 [16];
  double dVar7;
  double dVar9;
  undefined1 auVar8 [16];
  double dVar10;
  undefined1 auVar11 [16];
  VectorN Sxi_xi_compact;
  Matrix3xN e_bar;
  DenseStorage<double,_8,_8,_1,_0> local_180;
  undefined1 local_140 [64];
  undefined1 local_100 [64];
  undefined1 local_c0 [64];
  
  Calc_Sxi_xi_compact(this,(VectorN *)&local_180,xi,0.0,0.0);
  CalcCoordMatrix(this,(Matrix3xN *)local_140);
  auVar4 = vmulpd_avx512f((undefined1  [64])local_180.m_data.array,local_140);
  auVar2 = vextractf64x4_avx512f(auVar4,1);
  dVar7 = auVar4._0_8_ + auVar2._0_8_ + auVar4._8_8_ + auVar2._8_8_;
  dVar9 = auVar4._16_8_ + auVar2._16_8_ + auVar4._24_8_ + auVar2._24_8_;
  auVar4 = vmulpd_avx512f((undefined1  [64])local_180.m_data.array,local_100);
  auVar5 = vmulpd_avx512f((undefined1  [64])local_180.m_data.array,local_c0);
  auVar8._0_8_ = dVar7 + dVar9;
  auVar8._8_8_ = dVar7 + dVar9;
  auVar2 = vextractf64x4_avx512f(auVar4,1);
  auVar3 = vextractf64x4_avx512f(auVar5,1);
  dVar10 = auVar4._0_8_ + auVar2._0_8_ + auVar4._8_8_ + auVar2._8_8_ +
           auVar4._16_8_ + auVar2._16_8_ + auVar4._24_8_ + auVar2._24_8_;
  dVar7 = auVar5._0_8_ + auVar3._0_8_ + auVar5._8_8_ + auVar3._8_8_;
  dVar9 = auVar5._16_8_ + auVar3._16_8_ + auVar5._24_8_ + auVar3._24_8_;
  auVar6._0_8_ = dVar7 + dVar9;
  auVar6._8_8_ = dVar7 + dVar9;
  auVar11._8_8_ = 0;
  auVar11._0_8_ = dVar10 * dVar10;
  auVar11 = vfmadd231sd_fma(auVar11,auVar8,auVar8);
  auVar11 = vfmadd231sd_fma(auVar11,auVar6,auVar6);
  auVar11 = vsqrtsd_avx(auVar11,auVar11);
  bVar1 = 2.2250738585072014e-308 <= auVar11._0_8_;
  dVar7 = 1.0 / auVar11._0_8_;
  __return_storage_ptr__->m_data[0] =
       (double)((ulong)bVar1 * (long)(auVar8._0_8_ * dVar7) + (ulong)!bVar1 * 0x3ff0000000000000);
  __return_storage_ptr__->m_data[1] = (double)((ulong)bVar1 * (long)(dVar10 * dVar7));
  __return_storage_ptr__->m_data[2] = (double)((ulong)bVar1 * (long)(auVar6._0_8_ * dVar7));
  return __return_storage_ptr__;
}

Assistant:

ChVector<> ChElementBeamANCF_3243::ComputeTangent(const double xi) {
    VectorN Sxi_xi_compact;
    Calc_Sxi_xi_compact(Sxi_xi_compact, xi, 0, 0);

    Matrix3xN e_bar;
    CalcCoordMatrix(e_bar);

    // partial derivative of the position vector with respect to xi (normalized coordinate along the beam axis).  In
    // general, this will not be a unit vector
    ChVector<double> BeamAxisTangent = e_bar * Sxi_xi_compact;

    return BeamAxisTangent.GetNormalized();
}